

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O0

string * __thiscall
cfd::api::KeyApi::GetPubkeyFromPrivkey(KeyApi *this,string *privkey,bool is_compressed)

{
  byte in_CL;
  string *in_RDX;
  string *in_RDI;
  bool has_wif;
  NetType net_type;
  Privkey key;
  string *this_00;
  Pubkey local_b0;
  Privkey local_98;
  Privkey local_78;
  undefined1 local_45;
  NetType local_44;
  Privkey local_40;
  byte local_19;
  string *local_18;
  
  local_19 = in_CL & 1;
  this_00 = in_RDI;
  local_18 = in_RDX;
  core::Privkey::Privkey(&local_40);
  local_44 = kMainnet;
  local_45 = core::Privkey::HasWif(local_18,&local_44,(bool *)0x0);
  if ((bool)local_45) {
    core::Privkey::FromWif(&local_78,local_18,local_44,(bool)(local_19 & 1));
    core::Privkey::operator=((Privkey *)this_00,(Privkey *)in_RDI);
    core::Privkey::~Privkey((Privkey *)0x63f026);
  }
  else {
    core::Privkey::Privkey(&local_98,local_18,kMainnet,true);
    core::Privkey::operator=((Privkey *)this_00,(Privkey *)in_RDI);
    core::Privkey::~Privkey((Privkey *)0x63f072);
  }
  core::Privkey::GeneratePubkey(&local_b0,&local_40,(bool)(local_19 & 1));
  core::Pubkey::GetHex_abi_cxx11_(in_RDI,&local_b0);
  core::Pubkey::~Pubkey((Pubkey *)0x63f0ab);
  core::Privkey::~Privkey((Privkey *)0x63f0b8);
  return this_00;
}

Assistant:

std::string KeyApi::GetPubkeyFromPrivkey(
    const std::string& privkey, bool is_compressed) const {
  Privkey key;
  NetType net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(privkey, &net_type, nullptr);
  if (has_wif) {
    key = Privkey::FromWif(privkey, net_type, is_compressed);
  } else {
    key = Privkey(privkey);
  }
  return key.GeneratePubkey(is_compressed).GetHex();
}